

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1FreePage(PgHdr1 *p)

{
  uint *puVar1;
  PCache1 *pPVar2;
  
  if (p != (PgHdr1 *)0x0) {
    pPVar2 = p->pCache;
    pcache1Free((p->page).pBuf);
    if (pPVar2->bPurgeable != 0) {
      puVar1 = &pPVar2->pGroup->nCurrentPage;
      *puVar1 = *puVar1 - 1;
    }
  }
  return;
}

Assistant:

static void pcache1FreePage(PgHdr1 *p){
  if( ALWAYS(p) ){
    PCache1 *pCache = p->pCache;
    assert( sqlite3_mutex_held(p->pCache->pGroup->mutex) );
    pcache1Free(p->page.pBuf);
#ifdef SQLITE_PCACHE_SEPARATE_HEADER
    sqlite3_free(p);
#endif
    if( pCache->bPurgeable ){
      pCache->pGroup->nCurrentPage--;
    }
  }
}